

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

int __thiscall
CSocekt::flyd_epoll_oper_event
          (CSocekt *this,int fd,uint32_t eventtype,uint32_t flag,int bcaction,lp_connection_t pConn)

{
  int iVar1;
  int iVar2;
  SourceFile file;
  undefined1 local_ffc [12];
  undefined1 local_ff0 [12];
  Logger local_fe0;
  
  iVar2 = 1;
  if (eventtype == 3) {
    if (bcaction == 1) {
      flag = ~flag & pConn->events;
    }
    else if (bcaction == 0) {
      flag = flag | pConn->events;
    }
  }
  else if (eventtype != 1) {
    return 1;
  }
  pConn->events = flag;
  local_ffc._0_4_ = flag;
  local_ffc._4_8_ = pConn;
  iVar1 = epoll_ctl(this->m_epollhandle,eventtype,fd,(epoll_event *)local_ffc);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_ff0._0_8_;
    file.size_ = local_ff0._8_4_;
    muduo::Logger::Logger(&local_fe0,file,0x1f1,ERROR);
    muduo::LogStream::operator<<(&local_fe0.impl_.stream_,anon_var_dwarf_188ca);
    muduo::Logger::~Logger(&local_fe0);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int CSocekt::flyd_epoll_oper_event(
                        int                fd,               //句柄，一个socket
                        uint32_t           eventtype,        //事件类型，一般是EPOLL_CTL_ADD，EPOLL_CTL_MOD，EPOLL_CTL_DEL ，说白了就是操作epoll红黑树的节点(增加，修改，删除)
                        uint32_t           flag,             //标志，具体含义取决于eventtype
                        int                bcaction,         //补充动作，用于补充flag标记的不足  :  0：增加   1：去掉 2：完全覆盖 ,eventtype是EPOLL_CTL_MOD时这个参数就有用
                        lp_connection_t    pConn             //pConn：一个指针【其实是一个连接】，EPOLL_CTL_ADD时增加到红黑树中去，将来epoll_wait时能取出来用
                        )
{
    struct epoll_event ev;    
    memset(&ev, 0, sizeof(ev));

    if(eventtype == EPOLL_CTL_ADD) //往红黑树中增加节点；
    {
        //红黑树从无到有增加节点
        //ev.data.ptr = (void *)pConn;
        ev.events = flag;      //既然是增加节点，则不管原来是啥标记
        pConn->events = flag;  //这个连接本身也记录这个标记
    }
    else if(eventtype == EPOLL_CTL_MOD)
    {
        //节点已经在红黑树中，修改节点的事件信息
        ev.events = pConn->events;  //先把标记恢复回来
        if(bcaction == 0)
        {
            //增加某个标记            
            ev.events |= flag;
        }
        else if(bcaction == 1)
        {
            //去掉某个标记
            ev.events &= ~flag;
        }
        else
        {
            //完全覆盖某个标记            
            ev.events = flag;      //完全覆盖            
        }
        pConn->events = ev.events; //记录该标记
    }
    else
    {
        //删除红黑树中节点，目前没这个需求【socket关闭这项会自动从红黑树移除】，所以将来再扩展
        return  1;  //先直接返回1表示成功
    } 

    //原来的理解中，绑定ptr这个事，只在EPOLL_CTL_ADD的时候做一次即可，但是发现EPOLL_CTL_MOD似乎会破坏掉.data.ptr，因此不管是EPOLL_CTL_ADD，还是EPOLL_CTL_MOD，都给进去
    //找了下内核源码SYSCALL_DEFINE4(epoll_ctl, int, epfd, int, op, int, fd,		struct epoll_event __user *, event)，感觉真的会覆盖掉：
       //copy_from_user(&epds, event, sizeof(struct epoll_event)))，感觉这个内核处理这个事情太粗暴了
    ev.data.ptr = (void *)pConn;

    if(epoll_ctl(m_epollhandle,eventtype,fd,&ev) == -1)
    {
        LOG_ERROR << "CSocekt::ngx_epoll_oper_event()中epoll_ctl(%d,%ud,%ud,%d)失败." ;
        //ngx_log_stderr(errno,"CSocekt::ngx_epoll_oper_event()中epoll_ctl(%d,%ud,%ud,%d)失败.",fd,eventtype,flag,bcaction);    
        return -1;
    }
    return 1;
}